

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  byte *pbVar1;
  int iVar2;
  xmlNodePtr node_00;
  byte *expected_00;
  undefined4 in_register_0000000c;
  xmlChar *unaff_RBX;
  byte *pbVar3;
  ulong uVar4;
  int iVar5;
  xmlChar *in_stack_ffffffffffffffd8;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"minOccurs");
  if (node_00 != (xmlNodePtr)0x0) {
    expected_00 = xmlSchemaGetNodeContent(ctxt,node_00);
    pbVar3 = expected_00;
    while( true ) {
      uVar4 = (ulong)*pbVar3;
      if (0x20 < uVar4) break;
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0) goto LAB_001bfbae;
        break;
      }
      pbVar3 = pbVar3 + 1;
    }
    iVar5 = 0;
    if ((byte)(*pbVar3 - 0x30) < 10) {
      iVar5 = 0;
      do {
        iVar2 = 0x7fffffff;
        if ((iVar5 < 0xccccccd) &&
           (iVar2 = (int)uVar4 + -0x30 + iVar5 * 10, -0x7fffffd1 - (int)uVar4 < iVar5 * 10)) {
          iVar2 = 0x7fffffff;
        }
        iVar5 = iVar2;
        pbVar1 = pbVar3 + 1;
        uVar4 = (ulong)*pbVar1;
        pbVar3 = pbVar3 + 1;
      } while ((byte)(*pbVar1 - 0x30) < 10);
    }
    while (pbVar3 = pbVar3 + 1, (byte)uVar4 < 0x21) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((uVar4 == 0) && (-1 < iVar5)) {
          if (min == -1) {
            return iVar5;
          }
          if (iVar5 <= min) {
            return iVar5;
          }
        }
        break;
      }
      uVar4 = (ulong)*pbVar3;
    }
LAB_001bfbae:
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_0000000c,max),
               (char *)expected_00,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffd8,unaff_RBX);
  }
  return 1;
}

Assistant:

static int
xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "minOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}